

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode
TA_CallFunc(TA_ParamHolder *param,TA_Integer startIdx,TA_Integer endIdx,TA_Integer *outBegIdx,
           TA_Integer *outNbElement)

{
  int *piVar1;
  long lVar2;
  code *pcVar3;
  long in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  long in_R8;
  TA_FrameFunction function;
  TA_FuncInfo *funcInfo;
  TA_FuncDef *funcDef;
  TA_ParamHolderPriv *paramHolderPriv;
  TA_RetCode retCode;
  TA_RetCode local_4;
  
  if (((in_RDI == (undefined8 *)0x0) || (in_RCX == 0)) || (in_R8 == 0)) {
    local_4 = TA_BAD_PARAM;
  }
  else {
    piVar1 = (int *)*in_RDI;
    if (*piVar1 == -0x5dfd4dfe) {
      if (piVar1[8] == 0) {
        if (piVar1[9] == 0) {
          if (*(long *)(piVar1 + 10) == 0) {
            local_4 = TA_INVALID_HANDLE;
          }
          else {
            lVar2 = *(long *)(*(long *)(piVar1 + 10) + 0x30);
            if (lVar2 == 0) {
              local_4 = TA_INTERNAL_ERROR|TA_BAD_PARAM;
            }
            else {
              pcVar3 = *(code **)(lVar2 + 0x28);
              if (pcVar3 == (code *)0x0) {
                local_4 = TA_INTERNAL_ERROR|TA_BAD_PARAM;
              }
              else {
                local_4 = (*pcVar3)(piVar1,in_ESI,in_EDX,in_RCX,in_R8);
              }
            }
          }
        }
        else {
          local_4 = TA_OUTPUT_NOT_ALL_INITIALIZE;
        }
      }
      else {
        local_4 = TA_INPUT_NOT_ALL_INITIALIZE;
      }
    }
    else {
      local_4 = TA_INVALID_PARAM_HOLDER;
    }
  }
  return local_4;
}

Assistant:

TA_RetCode TA_CallFunc( const TA_ParamHolder *param,
                        TA_Integer            startIdx,
                        TA_Integer            endIdx,
                        TA_Integer           *outBegIdx,
                        TA_Integer           *outNbElement )
{
   TA_RetCode retCode;
   const TA_ParamHolderPriv *paramHolderPriv;

   const TA_FuncDef *funcDef;
   const TA_FuncInfo *funcInfo;
   TA_FrameFunction function;

   if( (param == NULL) ||
       (outBegIdx == NULL) ||
       (outNbElement == NULL) )
   {
      return TA_BAD_PARAM;
   }

   paramHolderPriv = (TA_ParamHolderPriv *)(param->hiddenData);
   if( paramHolderPriv->magicNumber != TA_PARAM_HOLDER_PRIV_MAGIC_NB )
   {
      return TA_INVALID_PARAM_HOLDER;
   }

   /* Check that all parameters are initialize (except the optInput). */
   if( paramHolderPriv->inBitmap != 0 )
   {
      return TA_INPUT_NOT_ALL_INITIALIZE;
   }

   if( paramHolderPriv->outBitmap != 0 )
   {
      return TA_OUTPUT_NOT_ALL_INITIALIZE;
   }

   /* Get the pointer on the function */
   funcInfo = paramHolderPriv->funcInfo;
   if( !funcInfo ) return TA_INVALID_HANDLE;
   funcDef = (const TA_FuncDef *)funcInfo->handle;
   if( !funcDef ) return TA_INTERNAL_ERROR(2);
   function = funcDef->function;
   if( !function ) return TA_INTERNAL_ERROR(2);

   /* Perform the function call. */
   retCode = (*function)( paramHolderPriv, startIdx, endIdx,
                          outBegIdx, outNbElement );
   return retCode;
}